

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

void __thiscall spv::Function::~Function(Function *this)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  pointer ppBVar3;
  Block *pBVar4;
  int i_1;
  int i;
  long lVar5;
  
  this->_vptr_Function = (_func_int **)&PTR__Function_001e3d68;
  lVar5 = 0;
  while( true ) {
    ppIVar1 = (this->parameterInstructions).
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->parameterInstructions).
                            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3) <=
        lVar5) break;
    pIVar2 = ppIVar1[lVar5];
    if (pIVar2 != (Instruction *)0x0) {
      (*pIVar2->_vptr_Instruction[1])();
    }
    lVar5 = lVar5 + 1;
  }
  lVar5 = 0;
  while( true ) {
    ppBVar3 = (this->blocks).
              super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->blocks).
                            super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar3) >> 3) <=
        lVar5) break;
    pBVar4 = ppBVar3[lVar5];
    if (pBVar4 != (Block *)0x0) {
      (*pBVar4->_vptr_Block[1])();
    }
    lVar5 = lVar5 + 1;
  }
  std::_Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>::~_Vector_base
            (&(this->blocks).
              super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>);
  std::_Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
  ~_Vector_base(&(this->parameterInstructions).
                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
               );
  Instruction::~Instruction(&this->functionInstruction);
  return;
}

Assistant:

virtual ~Function()
    {
        for (int i = 0; i < (int)parameterInstructions.size(); ++i)
            delete parameterInstructions[i];

        for (int i = 0; i < (int)blocks.size(); ++i)
            delete blocks[i];
    }